

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qbytearray.cpp
# Opt level: O3

QByteArray * unexpectedZlibError(QByteArray *__return_storage_ptr__,ZLibOp op,int err,char *msg)

{
  char *pcVar1;
  undefined7 in_register_00000031;
  long in_FS_OFFSET;
  QMessageLogger local_30;
  QByteArray *local_10;
  
  local_10 = *(QByteArray **)(in_FS_OFFSET + 0x28);
  local_30.context.version = 2;
  local_30.context.function._4_4_ = 0;
  local_30.context._4_8_ = 0;
  local_30.context._12_8_ = 0;
  local_30.context.category = "default";
  pcVar1 = "qCompress";
  if ((int)CONCAT71(in_register_00000031,op) != 0) {
    pcVar1 = "qUncompress";
  }
  if (msg == (char *)0x0) {
    msg = "";
  }
  QMessageLogger::warning(&local_30,"%s unexpected zlib error: %s (%d)",pcVar1,msg,(ulong)(uint)err)
  ;
  (__return_storage_ptr__->d).size = 0;
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (char *)0x0;
  if (*(QByteArray **)(in_FS_OFFSET + 0x28) == local_10) {
    return *(QByteArray **)(in_FS_OFFSET + 0x28);
  }
  __stack_chk_fail();
}

Assistant:

Q_DECL_COLD_FUNCTION
static QByteArray unexpectedZlibError(ZLibOp op, int err, const char *msg)
{
    qWarning("%s unexpected zlib error: %s (%d)",
             zlibOpAsString(op),
             msg ? msg : "",
             err);
    return QByteArray();
}